

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O0

bool __thiscall cmCTest::CompressString(cmCTest *this,string *str)

{
  int iVar1;
  uchar *puVar2;
  undefined8 uVar3;
  size_type __n;
  ostream *this_00;
  char *msg;
  uchar *output;
  undefined1 auVar4 [16];
  size_t rlen;
  undefined1 local_290 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> base64EncodedBuffer;
  string local_270 [32];
  undefined1 local_250 [8];
  ostringstream cmCTestLog_msg;
  allocator<unsigned_char> local_c1;
  undefined1 local_c0 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> out;
  int outSize;
  uchar *in;
  z_stream strm;
  int ret;
  string *str_local;
  cmCTest *this_local;
  
  strm.state = (internal_state *)0x0;
  strm.zalloc = (alloc_func)0x0;
  strm.zfree = (free_func)0x0;
  strm.reserved._4_4_ = cm_zlib_deflateInit_((z_streamp)&in,-1,"1.3.1",0x70);
  if (strm.reserved._4_4_ == 0) {
    puVar2 = (uchar *)std::__cxx11::string::c_str();
    uVar3 = std::__cxx11::string::size();
    auVar4._8_4_ = (int)((ulong)uVar3 >> 0x20);
    auVar4._0_8_ = uVar3;
    auVar4._12_4_ = 0x45300000;
    out.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ =
         (int)(((auVar4._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)uVar3) - 4503599627370496.0)) * 1.001 + 13.0);
    __n = (size_type)
          out.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._4_4_;
    std::allocator<unsigned_char>::allocator(&local_c1);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_c0,__n,&local_c1);
    std::allocator<unsigned_char>::~allocator(&local_c1);
    strm.next_in._0_4_ = std::__cxx11::string::size();
    strm.next_out._0_4_ =
         out.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage._4_4_;
    in = puVar2;
    strm.total_in =
         (uLong)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_c0);
    strm.reserved._4_4_ = cm_zlib_deflate((z_streamp)&in,4);
    this_local._7_1_ = strm.reserved._4_4_ == 1;
    if (this_local._7_1_) {
      cm_zlib_deflateEnd((z_streamp)&in);
      iVar1 = out.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage._4_4_ * 3;
      std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)((long)&rlen + 7));
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_290,
                 (long)(iVar1 / 2),(allocator<unsigned_char> *)((long)&rlen + 7));
      std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)((long)&rlen + 7));
      puVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_c0);
      output = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_290);
      cmsysBase64_Encode(puVar2,strm._32_8_,output,1);
      puVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_290);
      std::__cxx11::string::assign((char *)str,(ulong)puVar2);
      base64EncodedBuffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_290);
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_250);
      this_00 = std::operator<<((ostream *)local_250,"Error during gzip compression.");
      std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
      std::__cxx11::ostringstream::str();
      msg = (char *)std::__cxx11::string::c_str();
      Log(this,7,
          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmCTest.cxx"
          ,0xf00,msg,false);
      std::__cxx11::string::~string(local_270);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_250);
      base64EncodedBuffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
    }
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_c0);
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool cmCTest::CompressString(std::string& str)
{
  int ret;
  z_stream strm;

  strm.zalloc = Z_NULL;
  strm.zfree = Z_NULL;
  strm.opaque = Z_NULL;
  ret = deflateInit(&strm, -1); // default compression level
  if (ret != Z_OK) {
    return false;
  }

  unsigned char* in =
    reinterpret_cast<unsigned char*>(const_cast<char*>(str.c_str()));
  // zlib makes the guarantee that this is the maximum output size
  int outSize =
    static_cast<int>(static_cast<double>(str.size()) * 1.001 + 13.0);
  std::vector<unsigned char> out(outSize);

  strm.avail_in = static_cast<uInt>(str.size());
  strm.next_in = in;
  strm.avail_out = outSize;
  strm.next_out = out.data();
  ret = deflate(&strm, Z_FINISH);

  if (ret != Z_STREAM_END) {
    cmCTestLog(this, ERROR_MESSAGE,
               "Error during gzip compression." << std::endl);
    return false;
  }

  (void)deflateEnd(&strm);

  // Now base64 encode the resulting binary string
  std::vector<unsigned char> base64EncodedBuffer((outSize * 3) / 2);

  size_t rlen = cmsysBase64_Encode(out.data(), strm.total_out,
                                   base64EncodedBuffer.data(), 1);

  str.assign(reinterpret_cast<char*>(base64EncodedBuffer.data()), rlen);

  return true;
}